

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall solitaire::graphics::Renderer::renderStockPile(Renderer *this)

{
  GraphicsSystem *pGVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  Cards *pileCards;
  SelectedCardIndex local_28;
  uint local_1c;
  
  iVar2 = (*this->context->_vptr_Context[5])();
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x78))
                             ((long *)CONCAT44(extraout_var,iVar2));
  pileCards = (Cards *)(**(code **)(*plVar3 + 0x30))(plVar3);
  local_28.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(**(code **)(*plVar3 + 0x38))(plVar3);
  if ((pileCards->
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pileCards->
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pGVar1 = (this->graphicsSystem)._M_t.
             super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
             _M_head_impl;
    local_1c = (this->cardPlaceholderId).t;
    (*pGVar1->_vptr_GraphicsSystem[5])
              (pGVar1,&local_1c,&Layout::stockPilePosition,
               (anonymous_namespace)::cardPlaceholderTextureArea);
  }
  else {
    renderStockPileWithCards(this,pileCards,&local_28);
  }
  return;
}

Assistant:

void Renderer::renderStockPile() const {
    const auto& pile = context.getSolitaire().getStockPile();
    const auto& pileCards = pile.getCards();
    const auto& selectedCardIndex = pile.getSelectedCardIndex();

    if (pileCards.empty())
        renderCardPlaceholder(Layout::stockPilePosition);
    else renderStockPileWithCards(pileCards, selectedCardIndex);
}